

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O3

double __thiscall agg::bspline::get_stateful(bspline *this,double x)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint i;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  iVar10 = this->m_num;
  lVar8 = (long)iVar10;
  if (lVar8 < 3) {
    return 0.0;
  }
  pdVar3 = this->m_x;
  dVar11 = *pdVar3;
  if (x < dVar11) {
    dVar2 = *this->m_y;
    pdVar1 = this->m_y + 1;
    auVar12._0_8_ = -(pdVar3[1] - dVar11) * (this->m_am).m_array[1];
    auVar12._8_8_ = 0x8000000000000000;
    auVar13._0_8_ = *pdVar1 - dVar2;
    auVar13._8_8_ = *pdVar1 - dVar2;
    auVar12 = blendpd(auVar12,auVar13,2);
    auVar14._8_8_ = pdVar3[1] - dVar11;
    auVar14._0_8_ = 0x4018000000000000;
    auVar12 = divpd(auVar12,auVar14);
    return (x - dVar11) * (auVar12._0_8_ + auVar12._8_8_) + dVar2;
  }
  dVar11 = pdVar3[lVar8 + -1];
  if (dVar11 <= x) {
    dVar2 = this->m_y[lVar8 + -1];
    pdVar1 = this->m_y + lVar8 + -2;
    auVar15._0_8_ = (this->m_am).m_array[iVar10 - 2U] * (dVar11 - pdVar3[iVar10 - 2U]);
    auVar15._8_8_ = 0;
    auVar4._8_8_ = dVar2 - *pdVar1;
    auVar4._0_8_ = dVar2 - *pdVar1;
    auVar12 = blendpd(auVar15,auVar4,2);
    auVar5._8_8_ = dVar11 - pdVar3[iVar10 - 2U];
    auVar5._0_8_ = 0x4018000000000000;
    auVar12 = divpd(auVar12,auVar5);
    return (x - dVar11) * (auVar12._0_8_ + auVar12._8_8_) + dVar2;
  }
  i = this->m_last_idx;
  if ((int)i < 0) {
    this->m_last_idx = 0;
    uVar7 = iVar10 - 1;
    i = 0;
    do {
      uVar9 = (int)(i + uVar7) >> 1;
      uVar6 = uVar9;
      if (pdVar3[(int)uVar9] <= x) {
        this->m_last_idx = uVar9;
        uVar6 = uVar7;
        i = uVar9;
      }
      uVar7 = uVar6;
    } while (1 < (int)(uVar7 - i));
    goto LAB_001153fd;
  }
  if ((pdVar3[i] <= x) && (x < pdVar3[(ulong)i + 1] || x == pdVar3[(ulong)i + 1]))
  goto LAB_001153fd;
  if (i < iVar10 - 2U) {
    if ((pdVar3[(ulong)i + 1] <= x) && (x <= pdVar3[(ulong)i + 2])) {
      iVar10 = i + 1;
      goto LAB_00115438;
    }
    if (i != 0) goto LAB_00115357;
  }
  else {
LAB_00115357:
    if ((x <= pdVar3[i]) && (pdVar3[(ulong)i - 1] <= x)) {
      iVar10 = i - 1;
LAB_00115438:
      this->m_last_idx = iVar10;
      dVar11 = interpolation(this,x,iVar10);
      return dVar11;
    }
  }
  this->m_last_idx = 0;
  uVar7 = iVar10 - 1;
  i = 0;
  do {
    uVar9 = (int)(i + uVar7) >> 1;
    uVar6 = uVar9;
    if (pdVar3[(int)uVar9] <= x) {
      this->m_last_idx = uVar9;
      uVar6 = uVar7;
      i = uVar9;
    }
    uVar7 = uVar6;
  } while (1 < (int)(uVar7 - i));
LAB_001153fd:
  dVar11 = interpolation(this,x,i);
  return dVar11;
}

Assistant:

double bspline::get_stateful(double x) const
    {
        if(m_num > 2)
        {
            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            if(m_last_idx >= 0)
            {
                // Check if x is not in current range
                if(x < m_x[m_last_idx] || x > m_x[m_last_idx + 1])
                {
                    // Check if x between next points (most probably)
                    if(m_last_idx < m_num - 2 && 
                       x >= m_x[m_last_idx + 1] &&
                       x <= m_x[m_last_idx + 2])
                    {
                        ++m_last_idx;
                    }
                    else
                    if(m_last_idx > 0 && 
                       x >= m_x[m_last_idx - 1] && 
                       x <= m_x[m_last_idx])
                    {
                        // x is between pevious points
                        --m_last_idx;
                    }
                    else
                    {
                        // Else perform full search
                        bsearch(m_num, m_x, x, &m_last_idx);
                    }
                }
                return interpolation(x, m_last_idx);
            }
            else
            {
                // Interpolation
                bsearch(m_num, m_x, x, &m_last_idx);
                return interpolation(x, m_last_idx);
            }
        }
        return 0.0;
    }